

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void pulse_stream_destroy(cubeb_stream_conflict *stm)

{
  cubeb_log_level cVar1;
  pa_mainloop_api *ppVar2;
  cubeb_log_callback p_Var3;
  pa_stream *ppVar4;
  
  stream_cork(stm,CORK);
  (*cubeb_pa_threaded_mainloop_lock)(stm->context->mainloop);
  ppVar4 = stm->output_stream;
  if (ppVar4 != (pa_stream *)0x0) {
    if (stm->drain_timer != (pa_time_event *)0x0) {
      ppVar2 = (*cubeb_pa_threaded_mainloop_get_api)(stm->context->mainloop);
      (*ppVar2->time_free)(stm->drain_timer);
      ppVar4 = stm->output_stream;
    }
    (*cubeb_pa_stream_set_state_callback)(ppVar4,(pa_stream_notify_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_set_write_callback)
              (stm->output_stream,(pa_stream_request_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_disconnect)(stm->output_stream);
    (*cubeb_pa_stream_unref)(stm->output_stream);
  }
  if (stm->input_stream != (pa_stream *)0x0) {
    (*cubeb_pa_stream_set_state_callback)(stm->input_stream,(pa_stream_notify_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_set_read_callback)(stm->input_stream,(pa_stream_request_cb_t)0x0,(void *)0x0);
    (*cubeb_pa_stream_disconnect)(stm->input_stream);
    (*cubeb_pa_stream_unref)(stm->input_stream);
  }
  (*cubeb_pa_threaded_mainloop_unlock)(stm->context->mainloop);
  cVar1 = cubeb_log_get_level();
  if (cVar1 != CUBEB_LOG_DISABLED) {
    p_Var3 = cubeb_log_get_callback();
    if (p_Var3 != (cubeb_log_callback)0x0) {
      cubeb_log_internal("cubeb_pulse.c",0x43a,"Cubeb stream (%p) destroyed successfully.",stm);
    }
  }
  free(stm);
  return;
}

Assistant:

static void
pulse_stream_destroy(cubeb_stream * stm)
{
  stream_cork(stm, CORK);

  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  if (stm->output_stream) {

    if (stm->drain_timer) {
      /* there's no pa_rttime_free, so use this instead. */
      WRAP(pa_threaded_mainloop_get_api)
      (stm->context->mainloop)->time_free(stm->drain_timer);
    }

    WRAP(pa_stream_set_state_callback)(stm->output_stream, NULL, NULL);
    WRAP(pa_stream_set_write_callback)(stm->output_stream, NULL, NULL);
    WRAP(pa_stream_disconnect)(stm->output_stream);
    WRAP(pa_stream_unref)(stm->output_stream);
  }

  if (stm->input_stream) {
    WRAP(pa_stream_set_state_callback)(stm->input_stream, NULL, NULL);
    WRAP(pa_stream_set_read_callback)(stm->input_stream, NULL, NULL);
    WRAP(pa_stream_disconnect)(stm->input_stream);
    WRAP(pa_stream_unref)(stm->input_stream);
  }
  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  LOG("Cubeb stream (%p) destroyed successfully.", stm);
  free(stm);
}